

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_len(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  ushort uVar1;
  int iVar2;
  
  if (getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                               );
    if (iVar2 != 0) {
      getp_len::desc.min_argc_ = 0;
      getp_len::desc.opt_argc_ = 0;
      getp_len::desc.varargs_ = 0;
      __cxa_guard_release(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_len::desc);
  if (iVar2 == 0) {
    uVar1 = *(ushort *)lst;
    retval->typ = VM_INT;
    *(uint *)&retval->val = (uint)uVar1;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_len(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the element count */
    retval->set_int(vmb_get_len(lst));

    /* handled */
    return TRUE;
}